

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<int,_20> * __thiscall
TPZManVector<int,_20>::operator=(TPZManVector<int,_20> *this,TPZManVector<int,_20> *rval)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  
  if (this != rval) {
    uVar1 = (rval->super_TPZVec<int>).fNElements;
    piVar2 = (this->super_TPZVec<int>).fStore;
    piVar7 = this->fExtAlloc;
    if (piVar2 != piVar7 && piVar2 != (int *)0x0) {
      operator_delete__(piVar2);
      (this->super_TPZVec<int>).fStore = (int *)0x0;
    }
    if ((long)uVar1 < 0x15) {
      uVar5 = 0;
      uVar4 = 0;
      if (0 < (long)uVar1) {
        uVar4 = uVar1;
      }
      iVar3 = (int)uVar4;
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        piVar7[uVar5] = rval->fExtAlloc[uVar5];
      }
      for (; uVar6 = 0, (uint)((0x14 - iVar3) + (int)uVar5) != uVar4; uVar4 = uVar4 + 1) {
        piVar7[uVar4] = 0;
      }
    }
    else {
      piVar7 = (rval->super_TPZVec<int>).fStore;
      uVar6 = uVar1;
    }
    (this->super_TPZVec<int>).fStore = piVar7;
    (this->super_TPZVec<int>).fNAlloc = uVar6;
    (this->super_TPZVec<int>).fNElements = uVar1;
  }
  (rval->super_TPZVec<int>).fStore = (int *)0x0;
  (rval->super_TPZVec<int>).fNElements = 0;
  (rval->super_TPZVec<int>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}